

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_draw_index * nk_draw_list_alloc_elements(nk_draw_list *list,nk_size count)

{
  nk_draw_command *pnVar1;
  nk_draw_command *cmd;
  nk_draw_index *ids;
  nk_size count_local;
  nk_draw_list *list_local;
  
  if (list != (nk_draw_list *)0x0) {
    if (list == (nk_draw_list *)0x0) {
      list_local = (nk_draw_list *)0x0;
    }
    else {
      list_local = (nk_draw_list *)nk_buffer_alloc(list->elements,NK_BUFFER_FRONT,count << 1,2);
      if (list_local == (nk_draw_list *)0x0) {
        list_local = (nk_draw_list *)0x0;
      }
      else {
        pnVar1 = nk_draw_list_command_last(list);
        list->element_count = (int)count + list->element_count;
        pnVar1->elem_count = (int)count + pnVar1->elem_count;
      }
    }
    return (nk_draw_index *)list_local;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x1a67,"nk_draw_index *nk_draw_list_alloc_elements(struct nk_draw_list *, nk_size)"
               );
}

Assistant:

NK_INTERN nk_draw_index*
nk_draw_list_alloc_elements(struct nk_draw_list *list, nk_size count)
{
    nk_draw_index *ids;
    struct nk_draw_command *cmd;
    NK_STORAGE const nk_size elem_align = NK_ALIGNOF(nk_draw_index);
    NK_STORAGE const nk_size elem_size = sizeof(nk_draw_index);
    NK_ASSERT(list);
    if (!list) return 0;

    ids = (nk_draw_index*)
        nk_buffer_alloc(list->elements, NK_BUFFER_FRONT, elem_size*count, elem_align);
    if (!ids) return 0;
    cmd = nk_draw_list_command_last(list);
    list->element_count += (unsigned int)count;
    cmd->elem_count += (unsigned int)count;
    return ids;
}